

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_bckc(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  uVar3 = in->a;
  if ((int)uVar3 < 1) {
    iVar1 = back->ig;
    out->r = back->ir;
    out->g = iVar1;
    uVar3 = back->ib;
  }
  else if (uVar3 < 0xff) {
    dVar5 = (double)(int)uVar3 / 255.0;
    dVar4 = 1.0 - dVar5;
    bVar2 = sRGB(sRGB_to_d[in->r] * dVar5 + back->dr * dVar4);
    out->r = (uint)bVar2;
    bVar2 = sRGB(sRGB_to_d[in->g] * dVar5 + back->dg * dVar4);
    out->g = (uint)bVar2;
    bVar2 = sRGB(dVar5 * sRGB_to_d[in->b] + dVar4 * back->db);
    uVar3 = (uint)bVar2;
  }
  else {
    iVar1 = in->g;
    out->r = in->r;
    out->g = iVar1;
    uVar3 = in->b;
  }
  out->b = uVar3;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_bckc(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else if (in->a >= 255)
   {
      out->r = in->r;
      out->g = in->g;
      out->b = in->b;
   }

   else
   {
      double a = in->a / 255.;

      out->r = sRGB(sRGB_to_d[in->r] * a + back->dr * (1-a));
      out->g = sRGB(sRGB_to_d[in->g] * a + back->dg * (1-a));
      out->b = sRGB(sRGB_to_d[in->b] * a + back->db * (1-a));
   }

   out->a = 255;
}